

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void __thiscall
cmCacheManager::AddCacheEntry
          (cmCacheManager *this,string *key,cmValue value,cmValue helpString,CacheEntryType type)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  bool bVar1;
  mapped_type *this_00;
  long lVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  bool local_12a;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  string local_e0;
  reference local_c0;
  string *i;
  iterator __end3;
  iterator __begin3;
  cmList *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  iterator local_68;
  size_type local_60;
  undefined1 local_58 [8];
  cmList paths;
  CacheEntry *e;
  CacheEntryType type_local;
  string *key_local;
  cmCacheManager *this_local;
  cmValue helpString_local;
  cmValue value_local;
  
  this_local = (cmCacheManager *)helpString.Value;
  helpString_local = value;
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
            ::operator[](&this->Cache,key);
  paths.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = helpString_local.Value;
  CacheEntry::SetValue(this_00,helpString_local);
  this_00->Type = type;
  if ((type == FILEPATH) || (type == PATH)) {
    lVar2 = std::__cxx11::string::find((char)this_00,0x3b);
    if (lVar2 == -1) {
      cmsys::SystemTools::ConvertToUnixSlashes(&this_00->Value);
    }
    else {
      std::__cxx11::string::string((string *)&local_88,(string *)this_00);
      local_68 = &local_88;
      local_60 = 1;
      init._M_len = 1;
      init._M_array = local_68;
      cmList::cmList((cmList *)local_58,init);
      local_138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68;
      do {
        local_138 = local_138 + -1;
        std::__cxx11::string::~string((string *)local_138);
      } while (local_138 != &local_88);
      __end3 = cmList::begin_abi_cxx11_((cmList *)local_58);
      i = (string *)cmList::end_abi_cxx11_((cmList *)local_58);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&i), bVar1) {
        local_c0 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end3);
        cmsys::SystemTools::ConvertToUnixSlashes(local_c0);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      cmList::to_string_abi_cxx11_(&local_e0,(cmList *)local_58);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      cmList::~cmList((cmList *)local_58);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"HELPSTRING",&local_101);
  local_12a = cmValue::operator_cast_to_bool((cmValue *)&this_local);
  if (local_12a) {
    psVar3 = cmValue::operator*[abi_cxx11_((cmValue *)&this_local);
    std::__cxx11::string::string((string *)&local_128,(string *)psVar3);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"(This variable does not exist and should not be used)",
               &local_129);
  }
  local_12a = !local_12a;
  CacheEntry::SetProperty(this_00,&local_100,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  if (local_12a) {
    std::allocator<char>::~allocator(&local_129);
  }
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  return;
}

Assistant:

void cmCacheManager::AddCacheEntry(const std::string& key, cmValue value,
                                   cmValue helpString,
                                   cmStateEnums::CacheEntryType type)
{
  CacheEntry& e = this->Cache[key];
  e.SetValue(value);
  e.Type = type;
  // make sure we only use unix style paths
  if (type == cmStateEnums::FILEPATH || type == cmStateEnums::PATH) {
    if (e.Value.find(';') != std::string::npos) {
      cmList paths{ e.Value };
      for (std::string& i : paths) {
        cmSystemTools::ConvertToUnixSlashes(i);
      }
      e.Value = paths.to_string();
    } else {
      cmSystemTools::ConvertToUnixSlashes(e.Value);
    }
  }
  e.SetProperty(
    "HELPSTRING",
    helpString ? *helpString
               : std::string{
                   "(This variable does not exist and should not be used)" });
}